

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O2

FormInfo * AddFormInfo(char *value,char *contenttype,FormInfo *parent_form_info)

{
  FormInfo *pFVar1;
  
  pFVar1 = (FormInfo *)(*Curl_ccalloc)(1,0x80);
  if (pFVar1 != (FormInfo *)0x0) {
    if (value != (char *)0x0) {
      pFVar1->value = value;
    }
    if (contenttype != (char *)0x0) {
      pFVar1->contenttype = contenttype;
    }
    pFVar1->flags = 1;
    pFVar1->more = parent_form_info->more;
    parent_form_info->more = pFVar1;
  }
  return pFVar1;
}

Assistant:

static FormInfo * AddFormInfo(char *value,
                              char *contenttype,
                              FormInfo *parent_form_info)
{
  FormInfo *form_info;
  form_info = calloc(1, sizeof(struct FormInfo));
  if(form_info) {
    if(value)
      form_info->value = value;
    if(contenttype)
      form_info->contenttype = contenttype;
    form_info->flags = HTTPPOST_FILENAME;
  }
  else
    return NULL;

  if(parent_form_info) {
    /* now, point our 'more' to the original 'more' */
    form_info->more = parent_form_info->more;

    /* then move the original 'more' to point to ourselves */
    parent_form_info->more = form_info;
  }

  return form_info;
}